

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_MultipleInputsWithImport_DescriptorSetIn_Test::TestBody
          (CommandLineInterfaceTest_MultipleInputsWithImport_DescriptorSetIn_Test *this)

{
  FileDescriptorProto *pFVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  DescriptorProto *pDVar4;
  FieldDescriptorProto *pFVar5;
  AlphaNum *in_R8;
  AlphaNum *c;
  string_view format;
  string_view format_00;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  AlphaNum local_660;
  AlphaNum local_630;
  AlphaNum local_600;
  string local_5d0;
  Arg local_5b0;
  basic_string_view<char,_std::char_traits<char>_> local_580;
  string local_570;
  allocator<char> local_549;
  undefined1 local_548 [79];
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  AlphaNum local_2d0;
  AlphaNum local_2a0;
  AlphaNum local_270;
  string local_240;
  Arg local_220;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  string local_1e0;
  string_view local_1c0;
  string_view local_1b0;
  FieldDescriptorProto *local_1a0;
  FieldDescriptorProto *field;
  DescriptorProto *message;
  FileDescriptorProto *local_180;
  FileDescriptorProto *file_descriptor_proto;
  FileDescriptorSet file_descriptor_set;
  CommandLineInterfaceTest_MultipleInputsWithImport_DescriptorSetIn_Test *this_local;
  
  file_descriptor_set.field_0._48_8_ = this;
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)&file_descriptor_proto);
  pFVar1 = FileDescriptorSet::add_file((FileDescriptorSet *)&file_descriptor_proto);
  local_180 = pFVar1;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pFVar1->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar1);
  protobuf::internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.name_,"foo.proto",pAVar3);
  pDVar4 = FileDescriptorProto::add_message_type(local_180);
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pDVar4->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pDVar4);
  protobuf::internal::ArenaStringPtr::Set(&(pDVar4->field_0)._impl_.name_,"Foo",pAVar3);
  pFVar1 = FileDescriptorSet::add_file((FileDescriptorSet *)&file_descriptor_proto);
  local_180 = pFVar1;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pFVar1->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar1);
  protobuf::internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.name_,"bar.proto",pAVar3);
  FileDescriptorProto::add_dependency<char_const(&)[10]>(local_180,(char (*) [10])0x1e1cf74);
  pDVar4 = FileDescriptorProto::add_message_type(local_180);
  field = (FieldDescriptorProto *)pDVar4;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pDVar4->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pDVar4);
  protobuf::internal::ArenaStringPtr::Set(&(pDVar4->field_0)._impl_.name_,"Bar",pAVar3);
  pFVar5 = DescriptorProto::add_field((DescriptorProto *)field);
  local_1a0 = pFVar5;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pFVar5->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar5);
  protobuf::internal::ArenaStringPtr::Set(&(pFVar5->field_0)._impl_.type_name_,"Baz",pAVar3);
  pFVar5 = local_1a0;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(local_1a0->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar5);
  protobuf::internal::ArenaStringPtr::Set(&(pFVar5->field_0)._impl_.name_,"a",pAVar3);
  FieldDescriptorProto::set_number(local_1a0,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b0,"foo_and_bar.bin");
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,local_1b0,
             (FileDescriptorSet *)&file_descriptor_proto);
  FileDescriptorSet::clear_file((FileDescriptorSet *)&file_descriptor_proto);
  pFVar1 = FileDescriptorSet::add_file((FileDescriptorSet *)&file_descriptor_proto);
  local_180 = pFVar1;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pFVar1->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar1);
  protobuf::internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.name_,"baz.proto",pAVar3);
  pDVar4 = FileDescriptorProto::add_message_type(local_180);
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pDVar4->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pDVar4);
  protobuf::internal::ArenaStringPtr::Set(&(pDVar4->field_0)._impl_.name_,"Baz",pAVar3);
  pFVar1 = FileDescriptorSet::add_file((FileDescriptorSet *)&file_descriptor_proto);
  local_180 = pFVar1;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pFVar1->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar1);
  protobuf::internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.name_,"bat.proto",pAVar3);
  FileDescriptorProto::add_dependency<char_const(&)[10]>(local_180,(char (*) [10])0x1e1cf74);
  pDVar4 = FileDescriptorProto::add_message_type(local_180);
  field = (FieldDescriptorProto *)pDVar4;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pDVar4->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pDVar4);
  protobuf::internal::ArenaStringPtr::Set(&(pDVar4->field_0)._impl_.name_,"Bat",pAVar3);
  pFVar5 = DescriptorProto::add_field((DescriptorProto *)field);
  local_1a0 = pFVar5;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(pFVar5->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar5);
  protobuf::internal::ArenaStringPtr::Set(&(pFVar5->field_0)._impl_.type_name_,"Baz",pAVar3);
  pFVar5 = local_1a0;
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(local_1a0->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar5);
  protobuf::internal::ArenaStringPtr::Set(&(pFVar5->field_0)._impl_.name_,"a",pAVar3);
  FieldDescriptorProto::set_number(local_1a0,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c0,"baz_and_bat.bin");
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,local_1c0,
             (FileDescriptorSet *)&file_descriptor_proto);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f0,
             "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir --descriptor_set_in=$0 foo.proto bar.proto"
            );
  absl::lts_20250127::AlphaNum::AlphaNum(&local_270,"$tmpdir/foo_and_bar.bin");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_2a0,":");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_2d0,"$tmpdir/baz_and_bat.bin");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_240,(lts_20250127 *)&local_270,&local_2a0,&local_2d0,in_R8);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_220,&local_240);
  format._M_str = (char *)&local_220;
  format._M_len = (size_t)local_1f0._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_1e0,(lts_20250127 *)local_1f0._M_len,format,(Arg *)in_R8);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_240);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"test_generator",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"foo.proto,bar.proto",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"foo.proto",&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"Foo",&local_369);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_2f0,&local_318,&local_340,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"test_generator",&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"foo.proto,bar.proto",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"bar.proto",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"Bar",&local_409);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_390,&local_3b8,&local_3e0,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"test_plugin",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"foo.proto,bar.proto",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"foo.proto",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"Foo",&local_4a9);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_430,&local_458,&local_480,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"test_plugin",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"foo.proto,bar.proto",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_548 + 0x28),"bar.proto",(allocator<char> *)(local_548 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_548,"Bar",&local_549);
  c = (AlphaNum *)local_548;
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_4d0,&local_4f8,
             (string *)(local_548 + 0x28),(string *)c);
  std::__cxx11::string::~string((string *)local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)(local_548 + 0x28));
  std::allocator<char>::~allocator((allocator<char> *)(local_548 + 0x27));
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_580,
             "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir --descriptor_set_in=$0 baz.proto bat.proto"
            );
  absl::lts_20250127::AlphaNum::AlphaNum(&local_600,"$tmpdir/foo_and_bar.bin");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_630,":");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_660,"$tmpdir/baz_and_bat.bin");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_5d0,(lts_20250127 *)&local_600,&local_630,&local_660,c);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_5b0,&local_5d0);
  format_00._M_str = (char *)&local_5b0;
  format_00._M_len = (size_t)local_580._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_570,(lts_20250127 *)local_580._M_len,format_00,(Arg *)c);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_5d0);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"test_generator",&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"baz.proto,bat.proto",&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"baz.proto",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"Baz",&local_6f9);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_680,&local_6a8,&local_6d0,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"test_generator",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"baz.proto,bat.proto",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"bat.proto",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"Bat",&local_799);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_720,&local_748,&local_770,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"test_plugin",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"baz.proto,bat.proto",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"baz.proto",&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"Baz",&local_839);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_7c0,&local_7e8,&local_810,&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"test_plugin",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"baz.proto,bat.proto",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b0,"bat.proto",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"Bat",&local_8d9);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_860,&local_888,&local_8b0,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)&file_descriptor_proto);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, MultipleInputsWithImport_DescriptorSetIn) {
  // Test parsing multiple input files with an import of a separate file.
  FileDescriptorSet file_descriptor_set;

  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("foo.proto");
  file_descriptor_proto->add_message_type()->set_name("Foo");

  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("bar.proto");
  file_descriptor_proto->add_dependency("baz.proto");
  DescriptorProto* message = file_descriptor_proto->add_message_type();
  message->set_name("Bar");
  FieldDescriptorProto* field = message->add_field();
  field->set_type_name("Baz");
  field->set_name("a");
  field->set_number(1);

  WriteDescriptorSet("foo_and_bar.bin", &file_descriptor_set);

  file_descriptor_set.clear_file();
  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("baz.proto");
  file_descriptor_proto->add_message_type()->set_name("Baz");

  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("bat.proto");
  file_descriptor_proto->add_dependency("baz.proto");
  message = file_descriptor_proto->add_message_type();
  message->set_name("Bat");
  field = message->add_field();
  field->set_type_name("Baz");
  field->set_name("a");
  field->set_number(1);

  WriteDescriptorSet("baz_and_bat.bin", &file_descriptor_set);
  Run(absl::Substitute(
      "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir "
      "--descriptor_set_in=$0 foo.proto bar.proto",
      absl::StrCat("$tmpdir/foo_and_bar.bin",
                   CommandLineInterface::kPathSeparator,
                   "$tmpdir/baz_and_bat.bin")));

  ExpectNoErrors();
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");

  Run(absl::Substitute(
      "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir "
      "--descriptor_set_in=$0 baz.proto bat.proto",
      absl::StrCat("$tmpdir/foo_and_bar.bin",
                   CommandLineInterface::kPathSeparator,
                   "$tmpdir/baz_and_bat.bin")));

  ExpectNoErrors();
  ExpectGeneratedWithMultipleInputs("test_generator", "baz.proto,bat.proto",
                                    "baz.proto", "Baz");
  ExpectGeneratedWithMultipleInputs("test_generator", "baz.proto,bat.proto",
                                    "bat.proto", "Bat");
  ExpectGeneratedWithMultipleInputs("test_plugin", "baz.proto,bat.proto",
                                    "baz.proto", "Baz");
  ExpectGeneratedWithMultipleInputs("test_plugin", "baz.proto,bat.proto",
                                    "bat.proto", "Bat");
}